

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::v5::internal::
     parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
               (wchar_t **begin,wchar_t *end,
               specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
               *eh)

{
  wchar_t *pwVar1;
  uint uVar2;
  wchar_t *pwVar3;
  
  pwVar1 = *begin;
  if ((pwVar1 == end) || (9 < (uint)(*pwVar1 + L'\xffffffd0'))) {
    __assert_fail("begin != end && \'0\' <= *begin && *begin <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x5b0,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&, const Char *, ErrorHandler &&) [Char = wchar_t, ErrorHandler = fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<wchar_t>>, wchar_t>>> &]"
                 );
  }
  if (*pwVar1 == L'0') {
    *begin = pwVar1 + 1;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    pwVar1 = *begin;
    while (pwVar3 = pwVar1 + 1, uVar2 < 0xccccccd) {
      uVar2 = (*pwVar1 + uVar2 * 10) - 0x30;
      *begin = pwVar3;
      if ((pwVar3 == end) || (pwVar1 = pwVar3, 9 < (uint)(*pwVar3 + L'\xffffffd0')))
      goto LAB_00204f2e;
    }
    uVar2 = 0x80000000;
LAB_00204f2e:
    if ((int)uVar2 < 0) {
      error_handler::on_error((error_handler *)begin,"number is too big");
    }
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}